

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.cpp
# Opt level: O3

void * RoboteqThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  SOCKET SVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int selectedchannels [3];
  int pws [3];
  CHRONO chrono_period;
  ROBOTEQ roboteq;
  char szTemp [256];
  char szSaveFilePath [256];
  char szCfgFilePath [256];
  timespec local_c78;
  undefined8 local_c68;
  undefined4 local_c60;
  int local_c58;
  int local_c54;
  timespec local_c50;
  long local_c40;
  ulong uStack_c38;
  long local_c30;
  ulong uStack_c28;
  timespec local_c20;
  int local_c10;
  double local_c08;
  double dStack_c00;
  double local_bf0;
  ROBOTEQ local_be8;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  iVar13 = (int)pParam;
  sprintf(local_138,"Roboteq%d.txt",(ulong)pParam & 0xffffffff);
  memset(&local_be8,0,0x8b0);
  iVar4 = clock_getres(4,&local_c20);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_c50), iVar4 == 0)) {
    local_c10 = 0;
    local_c40 = 0;
    uStack_c38 = 0;
    local_c30 = 0;
    uStack_c28 = 0;
  }
  iVar4 = 100;
  bVar2 = false;
  local_c54 = 0;
  do {
    bVar2 = !bVar2;
    local_c58 = iVar4;
    while( true ) {
      if (local_c10 == 0) {
        clock_gettime(4,&local_c78);
        local_c40 = local_c78.tv_sec;
        uStack_c38 = local_c78.tv_nsec;
        local_c78.tv_sec =
             ((local_c78.tv_sec + local_c30) - local_c50.tv_sec) +
             (long)(local_c78.tv_nsec + uStack_c28) / 1000000000;
        local_c78.tv_nsec = (long)(local_c78.tv_nsec + uStack_c28) % 1000000000 - local_c50.tv_nsec;
        if (local_c78.tv_nsec < 0) {
          local_c78.tv_sec = local_c78.tv_sec + ~((ulong)-local_c78.tv_nsec / 1000000000);
          local_c78.tv_nsec =
               local_c78.tv_nsec + 1000000000U +
               ((ulong)-local_c78.tv_nsec / 1000000000) * 1000000000;
        }
        local_c30 = local_c78.tv_sec;
        uStack_c28 = local_c78.tv_nsec;
      }
      iVar5 = clock_getres(4,&local_c20);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_c50), iVar5 == 0)) {
        local_c10 = 0;
        local_c30 = 0;
        uStack_c28 = 0;
        local_c40 = 0;
        uStack_c38 = 0;
      }
      local_c78.tv_sec = (long)(iVar4 / 1000);
      local_c78.tv_nsec = (long)((iVar4 % 1000) * 1000000);
      nanosleep(&local_c78,(timespec *)0x0);
      iVar5 = local_c58;
      if (bPauseRoboteq[iVar13] == 0) break;
      if (!bVar2) {
        puts("Roboteq paused.");
        SVar10 = local_be8.RS232Port.s;
        switch(local_be8.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_be8.RS232Port.hDev;
          goto LAB_001aabc8;
        case 1:
        case 3:
          iVar5 = local_be8.RS232Port.s;
          break;
        case 2:
          shutdown(local_be8.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar5 = local_be8.RS232Port.s_srv;
          break;
        default:
          goto switchD_001aab8a_default;
        }
        shutdown(iVar5,2);
LAB_001aabc8:
        iVar5 = close(iVar5);
        pcVar12 = "Roboteq disconnected.";
        if (iVar5 != 0) {
switchD_001aab8a_default:
          pcVar12 = "Roboteq disconnection failed.";
        }
        puts(pcVar12);
      }
      if (bExit != 0) {
        bVar3 = true;
        iVar4 = local_c58;
        goto LAB_001ab22d;
      }
      local_c78.tv_sec = 0;
      local_c78.tv_nsec = 100000000;
      nanosleep(&local_c78,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartRoboteq[iVar13] == 0) {
      if (bVar2) goto LAB_001aae42;
      if (robid < 0x8000) {
        if (((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) goto LAB_001aacdb;
LAB_001ab0d6:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        local_bf0 = u1 * 1000.0;
        local_c08 = u2 * 1000.0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        local_c68 = 0;
        local_c60 = 0;
        lVar11 = (long)local_be8.rightthrusterchan;
        dVar15 = local_c08 * 0.5;
        *(int *)((long)&local_c68 + lVar11 * 4) = (int)(local_bf0 * 0.5) + 0x5dc;
        lVar8 = (long)local_be8.leftthrusterchan;
        *(int *)((long)&local_c68 + lVar8 * 4) = (int)dVar15 + 0x5dc;
        iVar4 = *(int *)((long)&local_c68 + lVar11 * 4);
        if (1999 < iVar4) {
          iVar4 = 2000;
        }
        if (iVar4 < 0x3e9) {
          iVar4 = 1000;
        }
        *(int *)((long)&local_c68 + lVar11 * 4) = iVar4;
        iVar4 = *(int *)((long)&local_c68 + lVar8 * 4);
        if (1999 < iVar4) {
          iVar4 = 2000;
        }
        local_c78.tv_sec = 0;
        if (iVar4 < 0x3e9) {
          iVar4 = 1000;
        }
        local_c78.tv_nsec = local_c78.tv_nsec & 0xffffffff00000000;
        *(int *)((long)&local_c68 + lVar8 * 4) = iVar4;
        *(undefined4 *)((long)&local_c78.tv_sec + lVar11 * 4) = 1;
        *(undefined4 *)((long)&local_c78.tv_sec + lVar8 * 4) = 1;
      }
      else {
        if (((robid != 0x8000) && (robid != 0x200000)) && (robid != 0x100000)) goto LAB_001ab0d6;
LAB_001aacdb:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        local_c08 = uw_f;
        dStack_c00 = u_f;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        local_c78.tv_nsec = local_c78.tv_nsec & 0xffffffff00000000;
        local_c60 = 0;
        auVar17._0_4_ = (int)(local_c08 * 1000.0 * 0.5);
        auVar17._4_4_ = (int)(dStack_c00 * 1000.0 * 0.5);
        auVar17._8_8_ = 0;
        auVar16._0_4_ = -(uint)(auVar17._0_4_ < (int)DAT_001e0de0);
        auVar16._4_4_ = -(uint)(auVar17._4_4_ < DAT_001e0de0._4_4_);
        auVar16._8_4_ = -(uint)(0 < DAT_001e0de0._8_4_);
        auVar16._12_4_ = -(uint)(0 < DAT_001e0de0._12_4_);
        auVar17 = ~auVar16 & _DAT_001e0de0 | auVar17 & auVar16;
        auVar14._0_4_ = -(uint)((int)DAT_001e0df0 < auVar17._0_4_);
        auVar14._4_4_ = -(uint)(DAT_001e0df0._4_4_ < auVar17._4_4_);
        auVar14._8_4_ = -(uint)(DAT_001e0df0._8_4_ < auVar17._8_4_);
        auVar14._12_4_ = -(uint)(DAT_001e0df0._12_4_ < auVar17._12_4_);
        auVar17 = ~auVar14 & _DAT_001e0df0 | auVar17 & auVar14;
        local_c68 = CONCAT44(auVar17._4_4_ + 0x5dc,auVar17._0_4_ + 0x5dc);
        local_c78.tv_sec = 0x100000001;
      }
      iVar6 = SetAllPWMsRoboteq(&local_be8,(int *)&local_c78,(int *)&local_c68);
      iVar4 = iVar5;
      if (iVar6 == 0) goto LAB_001aaff4;
      puts("Connection to a Roboteq lost.");
      SVar10 = local_be8.RS232Port.s;
      switch(local_be8.RS232Port.DevType) {
      case 0:
        SVar10 = (int)local_be8.RS232Port.hDev;
        goto LAB_001ab1f8;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_be8.RS232Port.s,2);
        close(SVar10);
      case 4:
        SVar10 = local_be8.RS232Port.s_srv;
        break;
      default:
        goto switchD_001aadc8_default;
      }
      shutdown(SVar10,2);
LAB_001ab1f8:
      iVar4 = close(SVar10);
      pcVar12 = "Roboteq disconnected.";
      if (iVar4 != 0) {
switchD_001aadc8_default:
        pcVar12 = "Roboteq disconnection failed.";
      }
      puts(pcVar12);
LAB_001aae76:
      local_c54 = local_c54 + 1;
      if (ExitOnErrorCount <= local_c54 && 0 < ExitOnErrorCount) {
        bExit = 1;
        bVar3 = true;
        iVar4 = iVar5;
        break;
      }
      bVar2 = false;
      bVar3 = true;
      iVar4 = iVar5;
    }
    else {
      if (!bVar2) {
        puts("Restarting a Roboteq.");
        SVar10 = local_be8.RS232Port.s;
        switch(local_be8.RS232Port.DevType) {
        case 0:
          iVar4 = (int)local_be8.RS232Port.hDev;
          goto LAB_001aae14;
        case 1:
        case 3:
          iVar4 = local_be8.RS232Port.s;
          break;
        case 2:
          shutdown(local_be8.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar4 = local_be8.RS232Port.s_srv;
          break;
        default:
          goto switchD_001aac73_default;
        }
        shutdown(iVar4,2);
LAB_001aae14:
        iVar4 = close(iVar4);
        pcVar12 = "Roboteq disconnected.";
        if (iVar4 != 0) {
switchD_001aac73_default:
          pcVar12 = "Roboteq disconnection failed.";
        }
        puts(pcVar12);
      }
      bRestartRoboteq[iVar13] = 0;
LAB_001aae42:
      iVar6 = ConnectRoboteq(&local_be8,local_138);
      iVar4 = local_be8.threadperiod;
      if (iVar6 != 0) {
        local_c78.tv_sec = 1;
        local_c78.tv_nsec = 0;
        nanosleep(&local_c78,(timespec *)0x0);
        goto LAB_001aae76;
      }
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      ibat1_filtered = 0.0;
      vbat1_filtered = 0.0;
      if ((long)local_be8.vbat1analoginputchan != -1) {
        vbat1_filtered = local_be8.analoginputthreshold[local_be8.vbat1analoginputchan];
      }
      if ((long)local_be8.ibat1analoginputchan != -1) {
        ibat1_filtered = local_be8.analoginputthreshold[local_be8.ibat1analoginputchan];
      }
      ibat2_filtered = 0.0;
      vbat2_filtered = 0.0;
      if ((long)local_be8.vbat2analoginputchan != -1) {
        vbat2_filtered = local_be8.analoginputthreshold[local_be8.vbat2analoginputchan];
      }
      if ((long)local_be8.ibat2analoginputchan != -1) {
        ibat2_filtered = local_be8.analoginputthreshold[local_be8.ibat2analoginputchan];
      }
      vswitchthreshold = local_be8.analoginputthreshold[local_be8.switchanaloginputchan];
      vswitchcoef = local_be8.analoginputcoef[local_be8.switchanaloginputchan];
      vbat1_threshold = vbat1_filtered;
      vbat2_threshold = vbat2_filtered;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      if ((FILE *)local_be8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_be8.pfSaveFile);
        local_be8.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = true;
      if (local_be8.bSaveRawData == 0) {
LAB_001aaff4:
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (local_be8.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_338,"Roboteq",8);
        }
        else {
          sprintf(local_338,"%.127s",local_be8.szCfgFilePath);
        }
        sVar7 = strlen(local_338);
        iVar5 = (int)sVar7 + 1;
        uVar9 = sVar7 & 0xffffffff;
        do {
          if ((int)uVar9 < 1) goto LAB_001ab054;
          uVar1 = uVar9 - 1;
          iVar5 = iVar5 + -1;
          lVar8 = uVar9 - 1;
          uVar9 = uVar1;
        } while (local_338[lVar8] != '.');
        if ((uVar1 != 0) && (iVar5 <= (int)sVar7)) {
          memset(local_338 + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
        }
LAB_001ab054:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar12 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_238,"log/%.127s_%.64s.txt",local_338,pcVar12);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_be8.pfSaveFile = (FILE *)fopen(local_238,"wb");
        if ((FILE *)local_be8.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create Roboteq data file.");
          bVar3 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
LAB_001ab22d:
  local_c78.tv_nsec = local_c78.tv_nsec & 0xffffffff00000000;
  local_c68 = 0;
  local_c60 = 0;
  lVar8 = (long)local_be8.rightthrusterchan;
  *(undefined4 *)((long)&local_c68 + lVar8 * 4) = 0x5dc;
  lVar11 = (long)local_be8.leftthrusterchan;
  *(undefined4 *)((long)&local_c68 + lVar11 * 4) = 0x5dc;
  iVar13 = *(int *)((long)&local_c68 + lVar8 * 4);
  if (1999 < iVar13) {
    iVar13 = 2000;
  }
  if (iVar13 < 0x3e9) {
    iVar13 = 1000;
  }
  *(int *)((long)&local_c68 + lVar8 * 4) = iVar13;
  iVar13 = *(int *)((long)&local_c68 + lVar11 * 4);
  iVar5 = 2000;
  if (iVar13 < 2000) {
    iVar5 = iVar13;
  }
  local_c78.tv_sec = 0;
  if (iVar5 < 0x3e9) {
    iVar5 = 1000;
  }
  *(int *)((long)&local_c68 + lVar11 * 4) = iVar5;
  *(undefined4 *)((long)&local_c78.tv_sec + lVar8 * 4) = 1;
  *(undefined4 *)((long)&local_c78.tv_sec + lVar11 * 4) = 1;
  SetAllPWMsRoboteq(&local_be8,(int *)&local_c78,(int *)&local_c68);
  local_c78.tv_sec = (__time_t)(iVar4 / 1000);
  local_c78.tv_nsec = (long)((iVar4 % 1000) * 1000000);
  nanosleep(&local_c78,(timespec *)0x0);
  if (local_c10 == 0) {
    clock_gettime(4,&local_c78);
    local_c40 = local_c78.tv_sec;
    uStack_c38 = local_c78.tv_nsec;
    local_c78.tv_sec =
         ((local_c78.tv_sec + local_c30) - local_c50.tv_sec) +
         (long)(local_c78.tv_nsec + uStack_c28) / 1000000000;
    local_c78.tv_nsec = (long)(local_c78.tv_nsec + uStack_c28) % 1000000000 - local_c50.tv_nsec;
    if (local_c78.tv_nsec < 0) {
      local_c78.tv_sec = local_c78.tv_sec + ~((ulong)-local_c78.tv_nsec / 1000000000);
      local_c78.tv_nsec =
           local_c78.tv_nsec + 1000000000U + ((ulong)-local_c78.tv_nsec / 1000000000) * 1000000000;
    }
    local_c30 = local_c78.tv_sec;
    uStack_c28 = local_c78.tv_nsec;
  }
  if ((FILE *)local_be8.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_be8.pfSaveFile);
    local_be8.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001ab451;
  switch(local_be8.RS232Port.DevType) {
  case 0:
    goto LAB_001ab431;
  case 1:
  case 3:
    SVar10 = local_be8.RS232Port.s;
    break;
  case 2:
    shutdown(local_be8.RS232Port.s,2);
    close(local_be8.RS232Port.s);
  case 4:
    SVar10 = local_be8.RS232Port.s_srv;
    break;
  default:
    goto switchD_001ab3f9_default;
  }
  shutdown(SVar10,2);
  local_be8.RS232Port.hDev._0_4_ = SVar10;
LAB_001ab431:
  iVar4 = close((int)local_be8.RS232Port.hDev);
  if (iVar4 == 0) {
    pcVar12 = "Roboteq disconnected.";
  }
  else {
switchD_001ab3f9_default:
    pcVar12 = "Roboteq disconnection failed.";
  }
  puts(pcVar12);
LAB_001ab451:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RoboteqThread(void* pParam)
{
	ROBOTEQ roboteq;
	double rudder = 0, thrust = 0, thrust1 = 0, thrust2 = 0;
	//int counter = 0, counter_modulo = 0;
	int res = EXIT_SUCCESS;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "Roboteq%d.txt", deviceid);

	memset(&roboteq, 0, sizeof(ROBOTEQ));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Roboteq paused.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a Roboteq.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			bRestartRoboteq[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRoboteq(&roboteq, szCfgFilePath) == EXIT_SUCCESS)
			{
				bConnected = TRUE;
				threadperiod = roboteq.threadperiod;

				EnterCriticalSection(&StateVariablesCS);

				if (roboteq.vbat1analoginputchan != -1) vbat1_filtered = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_filtered = 0;
				if (roboteq.vbat1analoginputchan != -1) vbat1_threshold = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_threshold = 0;
				if (roboteq.ibat1analoginputchan != -1) ibat1_filtered = roboteq.analoginputthreshold[roboteq.ibat1analoginputchan]; else ibat1_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_filtered = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_threshold = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_threshold = 0;
				if (roboteq.ibat2analoginputchan != -1) ibat2_filtered = roboteq.analoginputthreshold[roboteq.ibat2analoginputchan]; else ibat2_filtered = 0;
				vswitchcoef = roboteq.analoginputcoef[roboteq.switchanaloginputchan];
				vswitchthreshold = roboteq.analoginputthreshold[roboteq.switchanaloginputchan];

				LeaveCriticalSection(&StateVariablesCS);

				if (roboteq.pfSaveFile != NULL)
				{
					fclose(roboteq.pfSaveFile);
					roboteq.pfSaveFile = NULL;
				}
				if ((roboteq.bSaveRawData)&&(roboteq.pfSaveFile == NULL))
				{
					if (strlen(roboteq.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", roboteq.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "Roboteq");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					roboteq.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (roboteq.pfSaveFile == NULL)
					{
						printf("Unable to create Roboteq data file.\n");
						break;
					}
				}
			}
			else
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			res = EXIT_SUCCESS;

			switch (robid)
			{
			case BUGGY_SIMULATOR_ROBID:
			case BUGGY_ROBID:
			case SAILBOAT_SIMULATOR_ROBID:
			case VAIMOS_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudder = uw_f;
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				res = Set2ActuatorsRoboteq(&roboteq, rudder, thrust);
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				res = SetThrustersRoboteq(&roboteq, thrust1, thrust2);
				break;
			}

			if (res != EXIT_SUCCESS)
			{
				printf("Connection to a Roboteq lost.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
		}

		//printf("RoboteqThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersRoboteq(&roboteq, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (roboteq.pfSaveFile != NULL)
	{
		fclose(roboteq.pfSaveFile);
		roboteq.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRoboteq(&roboteq);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}